

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BigDictionaryTypeHandler * __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::NewBigDictionaryTypeHandler
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,Recycler *recycler,int slotCapacity,
          uint16 inlineSlotCapacity,uint16 offsetOfInlineSlots)

{
  Recycler *alloc;
  ES5ArrayTypeHandlerBase<int> *this_00;
  TrackAllocData local_48;
  uint16 local_20;
  uint16 local_1e;
  int local_1c;
  uint16 offsetOfInlineSlots_local;
  uint16 inlineSlotCapacity_local;
  int slotCapacity_local;
  Recycler *recycler_local;
  ES5ArrayTypeHandlerBase<unsigned_short> *this_local;
  
  local_20 = offsetOfInlineSlots;
  local_1e = inlineSlotCapacity;
  local_1c = slotCapacity;
  _offsetOfInlineSlots_local = recycler;
  recycler_local = (Recycler *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&ES5ArrayTypeHandlerBase<int>::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
             ,0x4e9);
  alloc = Memory::Recycler::TrackAllocInfo(recycler,&local_48);
  this_00 = (ES5ArrayTypeHandlerBase<int> *)new<Memory::Recycler>(0x40,alloc,0x43c4b0);
  ES5ArrayTypeHandlerBase<int>::ES5ArrayTypeHandlerBase<unsigned_short>
            (this_00,_offsetOfInlineSlots_local,local_1c,local_1e,local_20,this);
  return &this_00->super_DictionaryTypeHandlerBase<int>;
}

Assistant:

BigDictionaryTypeHandler* ES5ArrayTypeHandlerBase<T>::NewBigDictionaryTypeHandler(Recycler* recycler, int slotCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots)
    {
        return RecyclerNew(recycler, BigES5ArrayTypeHandler, recycler, slotCapacity, inlineSlotCapacity, offsetOfInlineSlots, this);
    }